

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udf_functions_to_test.hpp
# Opt level: O2

void duckdb::udf_several_constant_input<int,5>
               (DataChunk *input,ExpressionState *state,Vector *result)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  reference pvVar4;
  ulong uVar5;
  
  duckdb::Vector::SetVectorType((VectorType)result);
  lVar1 = *(long *)(result + 0x20);
  pvVar4 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)input,4);
  lVar2 = *(long *)(pvVar4 + 0x20);
  uVar3 = *(ulong *)(input + 0x18);
  for (uVar5 = 0; uVar5 < uVar3; uVar5 = uVar5 + 1) {
    *(undefined4 *)(lVar1 + uVar5 * 4) = *(undefined4 *)(lVar2 + uVar5 * 4);
  }
  return;
}

Assistant:

static void udf_several_constant_input(DataChunk &input, ExpressionState &state, Vector &result) {
	result.SetVectorType(VectorType::CONSTANT_VECTOR);
	auto result_data = ConstantVector::GetData<TYPE>(result);
	auto ldata = ConstantVector::GetData<TYPE>(input.data[NUM_INPUT - 1]);

	for (idx_t i = 0; i < input.size(); i++) {
		result_data[i] = ldata[i];
	}
}